

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::(anonymous_namespace)::HasOption<google::protobuf::BoolValue,bool>
          (_anonymous_namespace_ *this,RepeatedPtrField<google::protobuf::Option> *options,
          string_view name,bool value)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  reference this_00;
  string *this_01;
  Any *this_02;
  undefined1 local_90 [8];
  BoolValue wrapper;
  Option *option;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::Option> *__range3;
  bool value_local;
  RepeatedPtrField<google::protobuf::Option> *options_local;
  string_view name_local;
  
  __end3 = RepeatedPtrField<google::protobuf::Option>::begin
                     ((RepeatedPtrField<google::protobuf::Option> *)this);
  option = (Option *)
           RepeatedPtrField<google::protobuf::Option>::end
                     ((RepeatedPtrField<google::protobuf::Option> *)this);
  while (bVar1 = internal::operator!=(&__end3,(iterator *)&option), bVar1) {
    this_00 = internal::RepeatedPtrIterator<const_google::protobuf::Option>::operator*(&__end3);
    this_01 = Option::name_abi_cxx11_(this_00);
    __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    __y._M_str = (char *)name._M_len;
    __y._M_len = (size_t)options;
    wrapper._24_8_ = options;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      BoolValue::BoolValue((BoolValue *)local_90);
      this_02 = Option::value(this_00);
      bVar1 = Any::UnpackTo(this_02,(Message *)local_90);
      if ((bVar1) &&
         (bVar1 = BoolValue::value((BoolValue *)local_90), bVar1 == (bool)((byte)name._M_str & 1)))
      {
        name_local._M_str._7_1_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      BoolValue::~BoolValue((BoolValue *)local_90);
      if (bVar1) goto LAB_011d9b75;
    }
    internal::RepeatedPtrIterator<const_google::protobuf::Option>::operator++(&__end3);
  }
  name_local._M_str._7_1_ = 0;
LAB_011d9b75:
  return (bool)(name_local._M_str._7_1_ & 1);
}

Assistant:

bool HasOption(const RepeatedPtrField<Option>& options, absl::string_view name,
               T value) {
  for (const Option& option : options) {
    if (option.name() == name) {
      WrapperT wrapper;
      if (option.value().UnpackTo(&wrapper) && wrapper.value() == value) {
        return true;
      }
    }
  }
  return false;
}